

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O3

double __thiscall Function::getYInput(Function *this)

{
  FunctionType FVar1;
  Function *pFVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  
  FVar1 = this->eType;
  while( true ) {
    if (FVar1 == INPUT_Y) {
      (*(this->super_Physical)._vptr_Physical[0xc])();
      return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    pFVar2 = this->xLeft;
    if (((pFVar2 == (Function *)0x0) && (pFVar2 = this->xRight, pFVar2 == (Function *)0x0)) &&
       (pFVar2 = this->xPlus, pFVar2 == (Function *)0x0)) break;
    FVar1 = pFVar2->eType;
    this = pFVar2;
  }
  return 0.0;
}

Assistant:

double Function::getYInput()
{
	if (eType==INPUT_Y) {
		return getValue();
	}
	if (xLeft) return xLeft->getYInput();
	if (xRight) return xRight->getYInput();
	if (xPlus) return xPlus->getYInput();
	
	return 0.0;
}